

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *phrases)

{
  error_code *peVar1;
  pointer pcVar2;
  directory_iterator dVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_2f8;
  ifstream fi;
  dir_itr_imp local_2e8 [16];
  byte abStack_2d8 [488];
  size_type *local_f0;
  path targetDir;
  long local_c8;
  undefined1 local_c0 [16];
  size_type *local_b0;
  string cur_filename;
  size_type *local_88;
  string line;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_60;
  directory_iterator local_58;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_f0 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  cur_filename.field_2._8_8_ = phrases;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)&local_f0,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_2f8 = local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
    if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
      UNLOCK();
    }
  }
  local_60.px = (dir_itr_imp *)0x0;
  line.field_2._8_8_ = local_58.m_imp.px;
  _fi = 0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8.px = (dir_itr_imp *)line.field_2._8_8_;
  if (line.field_2._8_8_ == 0) {
    local_38.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
    UNLOCK();
    local_38.m_imp.px =
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)line.field_2._8_8_;
    if (line.field_2._8_8_ != 0) {
      LOCK();
      *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8.px = local_60.px;
  if (local_60.px == (dir_itr_imp *)0x0) {
    local_40.px = (dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_60.px = *(int *)local_60.px + 1;
    UNLOCK();
    local_40.px = local_60.px;
    if (local_60.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_60.px = *(int *)local_60.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  if (local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) {
    do {
      dVar3.m_imp.px = local_38.m_imp.px;
      if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
        if ((local_40.px == (dir_itr_imp *)0x0) || (*(long *)(local_40.px + 0x38) == 0)) break;
        if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
           (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
          __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                        "/usr/include/boost/filesystem/directory.hpp",0x140,
                        "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                       );
        }
      }
      peVar1 = (error_code *)((long)local_38.m_imp.px + 8);
      boost::filesystem::detail::status((path *)&local_2f8,peVar1);
      if ((int)local_2f8.px == 2) {
        boost::filesystem::path::extension();
        iVar5 = boost::filesystem::path::compare((path *)&local_2f8,"swp");
        if (local_2f8.px != local_2e8) {
          operator_delete(local_2f8.px);
        }
        if (iVar5 != 0) {
          std::ifstream::ifstream((istream *)&local_2f8,(string *)peVar1,_S_in);
          if ((abStack_2d8[*(long *)(local_2f8.px + -0x18)] & 5) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)((long)dVar3.m_imp.px + 8),
                                *(long *)((long)dVar3.m_imp.px + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doesn\'t exist",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            std::ifstream::~ifstream(&local_2f8);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_38.m_imp);
            bVar7 = false;
            goto LAB_0012216e;
          }
          local_88 = &line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_2f8.px + -0x18) +
                                  (char)(istream *)&local_2f8);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_2f8,(string *)&local_88,cVar4);
          boost::filesystem::path::filename();
          local_b0 = &cur_filename._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,targetDir.m_pathname.field_2._8_8_,
                     local_c8 + targetDir.m_pathname.field_2._8_8_);
          if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_c0) {
            operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
          }
          std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x6,0x13b255);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)cur_filename.field_2._8_8_,&local_b0,&local_88);
          if (local_b0 != &cur_filename._M_string_length) {
            operator_delete(local_b0);
          }
          if (local_88 != &line._M_string_length) {
            operator_delete(local_88);
          }
          std::ifstream::~ifstream((istream *)&local_2f8);
        }
      }
      boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
    } while (local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px
            );
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
  bVar7 = true;
LAB_0012216e:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)((long)&line.field_2 + 8));
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_58.m_imp);
  if (local_f0 != &targetDir.m_pathname._M_string_length) {
    operator_delete(local_f0);
  }
  return bVar7;
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::string>& phrases)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::getline(fi, line);
                std::string cur_filename = p.filename().string();
                cur_filename.replace(0, 6, "words");
                phrases.emplace(cur_filename, line);
            } 
        }
        return true;
    }